

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O3

void __thiscall
slang::ast::Scope::insertMember
          (Scope *this,Symbol *member,Symbol *at,bool isElaborating,bool incrementIndex)

{
  char *pcVar1;
  Symbol *pSVar2;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *arrays_;
  uint uVar3;
  bool bVar4;
  byte bVar5;
  SymbolIndex SVar6;
  uint uVar7;
  uint64_t hash;
  Symbol **ppSVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong pos0;
  basic_string_view<char,_std::char_traits<char>_> *pbVar13;
  undefined1 auVar14 [16];
  char cVar15;
  char cVar16;
  char cVar17;
  byte bVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  byte bVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  byte bVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  byte bVar30;
  try_emplace_args_t local_b1;
  basic_string_view<char,_std::char_traits<char>_> *local_b0;
  Symbol *member_local;
  long local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  uint64_t local_78;
  ulong local_70;
  char local_68;
  char cStack_67;
  char cStack_66;
  byte bStack_65;
  char cStack_64;
  char cStack_63;
  char cStack_62;
  byte bStack_61;
  char cStack_60;
  char cStack_5f;
  char cStack_5e;
  byte bStack_5d;
  char cStack_5c;
  char cStack_5b;
  char cStack_5a;
  byte bStack_59;
  char local_58;
  char cStack_57;
  char cStack_56;
  byte bStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  byte bStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  byte bStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  byte bStack_49;
  locator res;
  
  if (at == (Symbol *)0x0) {
    ppSVar8 = &this->firstMember;
    SVar6 = 1;
  }
  else {
    SVar6 = (uint)incrementIndex + at->indexInScope;
    ppSVar8 = &at->nextInScope;
  }
  pSVar2 = *ppSVar8;
  *ppSVar8 = member;
  member->indexInScope = SVar6;
  member->nextInScope = pSVar2;
  member->parentScope = this;
  if (pSVar2 == (Symbol *)0x0) {
    this->lastMember = member;
  }
  if (((member->name)._M_len != 0) &&
     ((uVar7 = member->kind - Port, 0x3b < uVar7 ||
      ((0x800000400000203U >> ((ulong)uVar7 & 0x3f) & 1) == 0)))) {
    pbVar13 = &member->name;
    arrays_ = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this->nameMap;
    member_local = member;
    hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     (arrays_,pbVar13);
    uVar12 = hash >> ((byte)*arrays_ & 0x3f);
    lVar11 = (hash & 0xff) * 4;
    cVar15 = (&UNK_00461acc)[lVar11];
    cVar16 = (&UNK_00461acd)[lVar11];
    cVar17 = (&UNK_00461ace)[lVar11];
    bVar18 = (&UNK_00461acf)[lVar11];
    uVar9 = (ulong)((uint)hash & 7);
    uVar10 = 0;
    pos0 = uVar12;
    cVar19 = cVar15;
    cVar20 = cVar16;
    cVar21 = cVar17;
    bVar22 = bVar18;
    cVar23 = cVar15;
    cVar24 = cVar16;
    cVar25 = cVar17;
    bVar26 = bVar18;
    cVar27 = cVar15;
    cVar28 = cVar16;
    cVar29 = cVar17;
    bVar30 = bVar18;
    do {
      pcVar1 = (char *)(*(long *)(arrays_ + 0x10) + uVar12 * 0x10);
      local_58 = *pcVar1;
      cStack_57 = pcVar1[1];
      cStack_56 = pcVar1[2];
      bStack_55 = pcVar1[3];
      cStack_54 = pcVar1[4];
      cStack_53 = pcVar1[5];
      cStack_52 = pcVar1[6];
      bStack_51 = pcVar1[7];
      cStack_50 = pcVar1[8];
      cStack_4f = pcVar1[9];
      cStack_4e = pcVar1[10];
      bStack_4d = pcVar1[0xb];
      cStack_4c = pcVar1[0xc];
      cStack_4b = pcVar1[0xd];
      cStack_4a = pcVar1[0xe];
      bVar5 = pcVar1[0xf];
      auVar14[0] = -(local_58 == cVar15);
      auVar14[1] = -(cStack_57 == cVar16);
      auVar14[2] = -(cStack_56 == cVar17);
      auVar14[3] = -(bStack_55 == bVar18);
      auVar14[4] = -(cStack_54 == cVar19);
      auVar14[5] = -(cStack_53 == cVar20);
      auVar14[6] = -(cStack_52 == cVar21);
      auVar14[7] = -(bStack_51 == bVar22);
      auVar14[8] = -(cStack_50 == cVar23);
      auVar14[9] = -(cStack_4f == cVar24);
      auVar14[10] = -(cStack_4e == cVar25);
      auVar14[0xb] = -(bStack_4d == bVar26);
      auVar14[0xc] = -(cStack_4c == cVar27);
      auVar14[0xd] = -(cStack_4b == cVar28);
      auVar14[0xe] = -(cStack_4a == cVar29);
      auVar14[0xf] = -(bVar5 == bVar30);
      uVar7 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
      bStack_49 = bVar5;
      if (uVar7 != 0) {
        local_a0 = *(long *)(arrays_ + 0x10) + uVar12 * 0x10;
        lVar11 = *(long *)(arrays_ + 0x18);
        local_b0 = pbVar13;
        local_98 = uVar12;
        local_90 = uVar10;
        local_88 = uVar9;
        local_80 = pos0;
        local_78 = hash;
        local_68 = cVar15;
        cStack_67 = cVar16;
        cStack_66 = cVar17;
        bStack_65 = bVar18;
        cStack_64 = cVar19;
        cStack_63 = cVar20;
        cStack_62 = cVar21;
        bStack_61 = bVar22;
        cStack_60 = cVar23;
        cStack_5f = cVar24;
        cStack_5e = cVar25;
        bStack_5d = bVar26;
        cStack_5c = cVar27;
        cStack_5b = cVar28;
        cStack_5a = cVar29;
        bStack_59 = bVar30;
        do {
          local_70 = (ulong)uVar7;
          uVar3 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          pbVar13 = (basic_string_view<char,_std::char_traits<char>_> *)
                    (lVar11 + uVar12 * 0x168 + (ulong)uVar3 * 0x18);
          bVar4 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             arrays_,local_b0,pbVar13);
          if (bVar4) {
            handleNameConflict(this,member,(Symbol **)(pbVar13 + 1),isElaborating);
            return;
          }
          uVar7 = (uint)local_70 - 1 & (uint)local_70;
        } while (uVar7 != 0);
        bVar5 = *(byte *)(local_a0 + 0xf);
        uVar9 = local_88;
        uVar10 = local_90;
        hash = local_78;
        uVar12 = local_98;
        pos0 = local_80;
        pbVar13 = local_b0;
        cVar15 = local_68;
        cVar16 = cStack_67;
        cVar17 = cStack_66;
        bVar18 = bStack_65;
        cVar19 = cStack_64;
        cVar20 = cStack_63;
        cVar21 = cStack_62;
        bVar22 = bStack_61;
        cVar23 = cStack_60;
        cVar24 = cStack_5f;
        cVar25 = cStack_5e;
        bVar26 = bStack_5d;
        cVar27 = cStack_5c;
        cVar28 = cStack_5b;
        cVar29 = cStack_5a;
        bVar30 = bStack_59;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar9] & bVar5) == 0) break;
      lVar11 = uVar12 + uVar10;
      uVar10 = uVar10 + 1;
      uVar12 = lVar11 + 1U & *(ulong *)(arrays_ + 8);
    } while (uVar10 <= *(ulong *)(arrays_ + 8));
    if (*(ulong *)(arrays_ + 0x28) < *(ulong *)(arrays_ + 0x20)) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                       *)arrays_,(arrays_type *)arrays_,pos0,hash,&local_b1,pbVar13,&member_local);
      *(long *)(arrays_ + 0x28) = *(long *)(arrays_ + 0x28) + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&,slang::ast::Symbol_const*&>
                (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::Symbol_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::Symbol_const*>>>
                       *)arrays_,hash,&local_b1,pbVar13,&member_local);
    }
  }
  return;
}

Assistant:

void Scope::insertMember(const Symbol* member, const Symbol* at, bool isElaborating,
                         bool incrementIndex) const {
    SLANG_ASSERT(!member->parentScope);
    SLANG_ASSERT(!member->nextInScope);

    if (!at) {
        member->indexInScope = SymbolIndex{1};
        member->nextInScope = std::exchange(firstMember, member);
    }
    else {
        member->indexInScope = at->indexInScope + (incrementIndex ? 1 : 0);
        member->nextInScope = std::exchange(at->nextInScope, member);
    }

    member->parentScope = this;
    if (!member->nextInScope)
        lastMember = member;

    // Add to the name map if the symbol has a name and can be looked up
    // by name in the default namespace.
    if (!member->name.empty() && canLookupByName(member->kind)) {
        auto pair = nameMap->emplace(member->name, member);
        if (!pair.second)
            handleNameConflict(*member, pair.first->second, isElaborating);
    }
}